

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ValueRangeExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,ValueRangeKind *args_1,Expression *args_2,
          Expression *args_3,SourceRange *args_4)

{
  ValueRangeKind VVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  ValueRangeExpression *pVVar4;
  
  pVVar4 = (ValueRangeExpression *)allocate(this,0x48,8);
  VVar1 = *args_1;
  SVar2 = args_4->startLoc;
  SVar3 = args_4->endLoc;
  (pVVar4->super_Expression).kind = ValueRange;
  (pVVar4->super_Expression).type.ptr = args;
  (pVVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pVVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pVVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pVVar4->super_Expression).sourceRange.endLoc = SVar3;
  pVVar4->rangeKind = VVar1;
  pVVar4->left_ = args_2;
  pVVar4->right_ = args_3;
  return pVVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }